

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

qreal __thiscall
QScrollerPrivate::nextSnapPos(QScrollerPrivate *this,qreal p,int dir,Orientation orientation)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar5;
  qreal qVar6;
  double dVar7;
  double dVar8;
  qreal last_1;
  qreal snapPos_3;
  qreal first_1;
  qreal snapPos_2;
  QList<double> *__range2_1;
  qreal last;
  qreal snapPos_1;
  qreal first;
  qreal snapPos;
  QList<double> *__range2;
  qreal maxPos;
  qreal minPos;
  qreal bestSnapPosDist;
  qreal bestSnapPos;
  qreal snapPosDist_3;
  qreal snapPosDist_2;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  qreal snapPosDist_1;
  qreal snapPosDist;
  const_iterator __end2;
  const_iterator __begin2;
  QList<double> *in_stack_ffffffffffffff10;
  double local_d8;
  double local_b0;
  double local_80;
  double local_78;
  double local_58;
  double local_50;
  double *local_48;
  const_iterator local_40;
  const_iterator local_38;
  double local_30;
  double local_28;
  double *local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = (double)qQNaN();
  local_80 = (double)qInf();
  if (in_EDX == 1) {
    qVar5 = QRectF::left((QRectF *)(in_RDI + 0x48));
    qVar6 = QRectF::right((QRectF *)(in_RDI + 0x48));
    local_10.i = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<double>::begin(in_stack_ffffffffffffff10);
    local_18.i = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<double>::end(in_stack_ffffffffffffff10);
    while( true ) {
      local_20 = local_18.i;
      bVar1 = QList<double>::const_iterator::operator!=(&local_10,local_18);
      if (!bVar1) break;
      pdVar3 = QList<double>::const_iterator::operator*(&local_10);
      dVar8 = *pdVar3;
      local_28 = dVar8 - in_XMM0_Qa;
      if ((((in_ESI < 1) || (0.0 <= local_28)) && ((-1 < in_ESI || (local_28 <= 0.0)))) &&
         (((qVar5 <= dVar8 && (dVar8 <= qVar6)) &&
          ((uVar4 = qIsNaN(local_78), (uVar4 & 1) != 0 ||
           (dVar7 = qAbs<double>(&local_28), dVar7 < local_80)))))) {
        local_80 = qAbs<double>(&local_28);
        local_78 = dVar8;
      }
      QList<double>::const_iterator::operator++(&local_10);
    }
    if (0.0 < *(double *)(in_RDI + 0x138)) {
      dVar8 = qVar5 + *(double *)(in_RDI + 0x130);
      if (in_ESI < 1) {
        if (in_ESI < 0) {
          iVar2 = qFloor<double>(5.44188605611841e-317);
          local_b0 = (double)iVar2 * *(double *)(in_RDI + 0x138) + dVar8;
        }
        else {
          local_b0 = dVar8;
          if (dVar8 < in_XMM0_Qa) {
            iVar2 = qFloor<double>(5.44194139147074e-317);
            local_b0 = (double)iVar2 * *(double *)(in_RDI + 0x138) + dVar8;
            if (in_XMM0_Qa < local_b0) {
              iVar2 = qRound(5.44199228023227e-317);
              local_b0 = (double)iVar2 * *(double *)(in_RDI + 0x138) + dVar8;
            }
          }
        }
      }
      else {
        iVar2 = qCeil<double>(5.44184307240722e-317);
        local_b0 = (double)iVar2 * *(double *)(in_RDI + 0x138) + dVar8;
      }
      if ((dVar8 <= local_b0) && (local_b0 <= qVar6)) {
        local_30 = local_b0 - in_XMM0_Qa;
        uVar4 = qIsNaN(local_78);
        if (((uVar4 & 1) != 0) || (dVar8 = qAbs<double>(&local_30), dVar8 < local_80)) {
          local_78 = local_b0;
          qAbs<double>(&local_30);
        }
      }
    }
  }
  else {
    qVar5 = QRectF::top((QRectF *)(in_RDI + 0x48));
    qVar6 = QRectF::bottom((QRectF *)(in_RDI + 0x48));
    local_38.i = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<double>::begin(in_stack_ffffffffffffff10);
    local_40.i = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<double>::end(in_stack_ffffffffffffff10);
    while( true ) {
      local_48 = local_40.i;
      bVar1 = QList<double>::const_iterator::operator!=(&local_38,local_40);
      if (!bVar1) break;
      pdVar3 = QList<double>::const_iterator::operator*(&local_38);
      dVar8 = *pdVar3;
      local_50 = dVar8 - in_XMM0_Qa;
      if (((((in_ESI < 1) || (0.0 <= local_50)) && ((-1 < in_ESI || (local_50 <= 0.0)))) &&
          ((qVar5 <= dVar8 && (dVar8 <= qVar6)))) &&
         ((uVar4 = qIsNaN(local_78), (uVar4 & 1) != 0 ||
          (dVar7 = qAbs<double>(&local_50), dVar7 < local_80)))) {
        local_80 = qAbs<double>(&local_50);
        local_78 = dVar8;
      }
      QList<double>::const_iterator::operator++(&local_38);
    }
    if (0.0 < *(double *)(in_RDI + 0x160)) {
      dVar8 = qVar5 + *(double *)(in_RDI + 0x158);
      if (in_ESI < 1) {
        if (in_ESI < 0) {
          iVar2 = qFloor<double>(5.44236925232004e-317);
          local_d8 = (double)iVar2 * *(double *)(in_RDI + 0x160) + dVar8;
        }
        else {
          local_d8 = dVar8;
          if (dVar8 < in_XMM0_Qa) {
            iVar2 = qFloor<double>(5.44242458767238e-317);
            local_d8 = (double)iVar2 * *(double *)(in_RDI + 0x160) + dVar8;
            if (in_XMM0_Qa < local_d8) {
              iVar2 = qRound(5.4424754764339e-317);
              local_d8 = (double)iVar2 * *(double *)(in_RDI + 0x160) + dVar8;
            }
          }
        }
      }
      else {
        iVar2 = qCeil<double>(5.44232626860885e-317);
        local_d8 = (double)iVar2 * *(double *)(in_RDI + 0x160) + dVar8;
      }
      if ((dVar8 <= local_d8) && (local_d8 <= qVar6)) {
        local_58 = local_d8 - in_XMM0_Qa;
        uVar4 = qIsNaN(local_78);
        if (((uVar4 & 1) != 0) || (dVar8 = qAbs<double>(&local_58), dVar8 < local_80)) {
          local_78 = local_d8;
          qAbs<double>(&local_58);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_78;
  }
  __stack_chk_fail();
}

Assistant:

qreal QScrollerPrivate::nextSnapPos(qreal p, int dir, Qt::Orientation orientation) const
{
    qreal bestSnapPos = Q_QNAN;
    qreal bestSnapPosDist = Q_INFINITY;

    qreal minPos;
    qreal maxPos;

    if (orientation == Qt::Horizontal) {
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
    } else {
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
    }

    if (orientation == Qt::Horizontal) {
        // the snap points in the list
        for (qreal snapPos : snapPositionsX) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist ) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalX > 0.0) {
            qreal first = minPos + snapFirstX;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalX) * snapIntervalX + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalX) * snapIntervalX + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist ) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }

    } else { // (orientation == Qt::Vertical)
        // the snap points in the list
        for (qreal snapPos : snapPositionsY) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalY > 0.0) {
            qreal first = minPos + snapFirstY;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalY) * snapIntervalY + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalY) * snapIntervalY + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }
    }

    return bestSnapPos;
}